

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O0

int __thiscall
EnvironmentROBARM::GetFromToHeuristic(EnvironmentROBARM *this,int FromStateID,int ToStateID)

{
  value_type pEVar1;
  reference ppEVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int h;
  EnvROBARMHashEntry_t *ToHashEntry;
  EnvROBARMHashEntry_t *FromHashEntry;
  
  ppEVar2 = std::vector<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_>::operator[]
                      ((vector<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_> *)
                       (in_RDI + 0x150),(long)in_ESI);
  pEVar1 = *ppEVar2;
  ppEVar2 = std::vector<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_>::operator[]
                      ((vector<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_> *)
                       (in_RDI + 0x150),(long)in_EDX);
  return *(int *)(*(long *)(*(long *)(in_RDI + 0x168) +
                           (long)(int)((uint)(*ppEVar2)->endeffx +
                                      (uint)(*ppEVar2)->endeffy * *(int *)(in_RDI + 0x38)) * 8) +
                 (long)(int)((uint)pEVar1->endeffx + (uint)pEVar1->endeffy * *(int *)(in_RDI + 0x38)
                            ) * 4);
}

Assistant:

int EnvironmentROBARM::GetFromToHeuristic(int FromStateID, int ToStateID)
{
#if USE_HEUR==0
    return 0;
#endif

#if DEBUG
    if(FromStateID >= (int)EnvROBARM.StateID2CoordTable.size()
        || ToStateID >= (int)EnvROBARM.StateID2CoordTable.size())
    {
        throw SBPL_Exception("ERROR in EnvROBARM... function: stateID illegal");
    }
#endif

    //get X, Y for the state
    EnvROBARMHashEntry_t* FromHashEntry = EnvROBARM.StateID2CoordTable[FromStateID];
    EnvROBARMHashEntry_t* ToHashEntry = EnvROBARM.StateID2CoordTable[ToStateID];

    int h =
            EnvROBARM.Heur[XYTO2DIND(ToHashEntry->endeffx, ToHashEntry->endeffy)][XYTO2DIND(FromHashEntry->endeffx, FromHashEntry->endeffy)];

    /*
     if(ToStateID != EnvROBARM.goalHashEntry->stateID)
     {
     //also consider the distanceincoord

     //get the heuristic based on angles
     unsigned int hangles = distanceincoord(FromHashEntry->coord, ToHashEntry->coord);

     //the heuristic is the max of the two
     h = __max(h, hangles);
     }
     */

    return h;
}